

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heavylight_test.cpp
# Opt level: O2

void __thiscall HeavyLight_Chains_Test::TestBody(HeavyLight_Chains_Test *this)

{
  pointer piVar1;
  char *message;
  pointer pvVar2;
  ulong uVar3;
  long lVar4;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_60;
  AssertHelper local_58;
  pointer local_50;
  internal local_48 [8];
  AssertionResult gtest_ar;
  
  srand(1);
  for (gtest_ar.message_.ptr_._4_4_ = 0; gtest_ar.message_.ptr_._4_4_ != 10;
      gtest_ar.message_.ptr_._4_4_ = gtest_ar.message_.ptr_._4_4_ + 1) {
    reset(0x32);
    generateTree(0x32);
    initHLD(0,0x32);
    local_50 = chains.
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    for (pvVar2 = chains.
                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; pvVar2 != local_50; pvVar2 = pvVar2 + 1
        ) {
      uVar3 = (ulong)((long)(pvVar2->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                            super__Vector_impl_data._M_finish -
                     (long)(pvVar2->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                           super__Vector_impl_data._M_start) >> 2 & 0xffffffff;
      lVar4 = uVar3 * 4 + -8;
      while( true ) {
        uVar3 = uVar3 - 1;
        if ((int)(uint)uVar3 < 1) break;
        piVar1 = (pvVar2->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        testing::internal::CmpHelperEQ<int,int>
                  (local_48,"c[i - 1]","pred[c[i]][0]",(int *)((long)piVar1 + lVar4),
                   pred[piVar1[(uint)uVar3 & 0x7fffffff]]);
        if (local_48[0] == (internal)0x0) {
          testing::Message::Message((Message *)&local_60);
          message = "";
          if (gtest_ar._0_8_ != 0) {
            message = *(char **)gtest_ar._0_8_;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_58,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/trinerdi[P]icpc-notebook/src/trinerdi/graph/heavylight_test.cpp"
                     ,0x1a,message);
          testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_60);
          testing::internal::AssertHelper::~AssertHelper(&local_58);
          testing::internal::
          scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr(&local_60);
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&gtest_ar);
        lVar4 = lVar4 + -4;
      }
    }
  }
  return;
}

Assistant:

TEST(HeavyLight, Chains) {
    srand(1);
    int n = 50;
    rep(tests, 0, 10) {
        reset(n);
        generateTree(n);
        initHLD(0, n);
        for (auto &c : chains) {
            per(i, 1, c.size()) {
                EXPECT_EQ(c[i - 1], pred[c[i]][0]);
            }
        }
    }
}